

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::statement(Parse *this)

{
  int iVar1;
  int iVar2;
  int index;
  Parse *this_local;
  
  iVar2 = this->curIndex;
  iVar1 = expressionStmt(this);
  if (iVar1 == 0) {
    this->curIndex = iVar2;
    iVar1 = compoundStmt(this);
    if (iVar1 == 0) {
      this->curIndex = iVar2;
      iVar1 = selectionStmt(this);
      if (iVar1 == 0) {
        this->curIndex = iVar2;
        iVar1 = iterationStmt(this);
        if (iVar1 == 0) {
          this->curIndex = iVar2;
          iVar2 = returnStmt(this);
          if (iVar2 == 0) {
            this_local._4_4_ = 0;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Parse::statement() {
    int index = curIndex;
    if(expressionStmt()) {
        return 1;
    }
    curIndex = index;
    if(compoundStmt()) {
        return 1;
    }
    curIndex = index;
    if(selectionStmt()) {
        return 1;
    }
    curIndex = index;
    if(iterationStmt()) {
        return 1;
    }
    curIndex = index;
    if(returnStmt()) {
        return 1;
    }
    return 0;
}